

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O3

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateFrameTabularText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char greenString [8];
  char redString [8];
  RGBValue rgb;
  Frame frame;
  char blueString [8];
  char buf [64];
  char local_b0 [8];
  char local_a8 [8];
  RGBValue local_a0;
  Frame local_98 [16];
  U64 local_88;
  char local_70 [8];
  char local_68 [72];
  
  AnalyzerResults::GetFrame((ulonglong)local_98);
  AnalyzerResults::ClearTabularText();
  local_a0 = RGBValue::CreateFromU64(local_88);
  GenerateRGBStrings(this,&local_a0,display_base,8,local_a8,local_b0,local_70);
  snprintf(local_68,0x40,"[%d] %s, %s, %s");
  AnalyzerResults::AddTabularText
            ((char *)this,local_68,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_98);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
#ifdef SUPPORTS_PROTOCOL_SEARCH
    Frame frame = GetFrame( frame_index );
    ClearTabularText();

    const U32 ledIndex = frame.mData2;
    const RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    const int colorNumericBufferLength = 8;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // target content: [13] 0x1A, 0x2B, 0x3C
    char buf[ 64 ];
    ::snprintf( buf, 64, "[%d] %s, %s, %s", ledIndex, redString, greenString, blueString );
    AddTabularText( buf );
#endif
}